

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch.c
# Opt level: O0

Integer pnga_sprs_array_count_sketch
                  (Integer s_a,Integer size_k,Integer *g_k,Integer *g_w,Integer trans)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  Integer IVar16;
  Integer IVar17;
  void *pvVar18;
  undefined8 *puVar19;
  void *__ptr;
  void *pvVar20;
  void *__ptr_00;
  void *__ptr_01;
  long lVar21;
  Integer *in_RCX;
  Integer *in_RDX;
  long in_RSI;
  long in_RDI;
  DoublePrecision DVar22;
  double zone [2];
  float cone [2];
  double done;
  float fone;
  longlong llone;
  long lone;
  int ione;
  double iv_3;
  double rv_3;
  double iw_3;
  double rw_3;
  float iv_2;
  float rv_2;
  float iw_2;
  float rw_2;
  Integer jdx_1;
  Integer kcols_1;
  Integer idx_1;
  int64_t *jptr_1;
  int64_t *iptr_1;
  double iv_1;
  double rv_1;
  double iw_1;
  double rw_1;
  float iv;
  float rv;
  float iw;
  float rw;
  Integer jdx;
  Integer kcols;
  Integer idx;
  int *jptr;
  int *iptr;
  Integer jhi;
  Integer jlo;
  void *vptr;
  Integer nblk;
  Integer irow;
  int val;
  Integer *size;
  Integer *map;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  Integer type;
  Integer idx_size;
  Integer kcnt;
  Integer kk;
  Integer k;
  Integer me;
  Integer nprocs;
  void *kbuf;
  Integer *list;
  Integer *top;
  Integer nblocks [2];
  Integer two;
  Integer one;
  Integer dims [2];
  Integer jdim;
  Integer idim;
  void *kweights;
  Integer *klabels;
  Integer nrows;
  Integer g_a;
  Integer hdl;
  Integer n;
  Integer jj;
  Integer j;
  Integer ii;
  Integer i;
  Integer in_stack_000002f0;
  Integer in_stack_00001120;
  void *in_stack_fffffffffffffd88;
  Integer *in_stack_fffffffffffffd90;
  void *in_stack_fffffffffffffd98;
  Integer *in_stack_fffffffffffffda0;
  Integer *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  Integer *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  float in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  float in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  void *in_stack_fffffffffffffe10;
  long in_stack_fffffffffffffe18;
  Integer in_stack_fffffffffffffe20;
  long local_1d8;
  long local_1d0;
  long local_180;
  long local_178;
  Integer local_170;
  Integer local_168;
  long local_160;
  Integer local_158;
  Integer in_stack_fffffffffffffeb0;
  int local_144;
  long local_f0;
  long local_e8;
  Integer in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  long local_50;
  long local_30;
  
  lVar14 = in_RDI + 1000;
  if (SPA[lVar14].idim < in_RSI) {
    pnga_error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  if (SPA[lVar14].type == 0x3f8) {
    pnga_error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  lVar15 = (SPA[lVar14].ihi - SPA[lVar14].ilo) + 1;
  lVar11 = SPA[lVar14].jdim;
  lVar12 = SPA[lVar14].idx_size;
  lVar13 = SPA[lVar14].type;
  IVar16 = pnga_pgroup_nnodes(SPA[lVar14].grp);
  IVar17 = pnga_pgroup_nodeid(SPA[lVar14].grp);
  pvVar18 = malloc(IVar16 << 3);
  puVar19 = (undefined8 *)malloc((IVar16 + 1) * 8);
  for (local_30 = 0; local_30 < IVar16; local_30 = local_30 + 1) {
    *(undefined8 *)((long)pvVar18 + local_30 * 8) = 0;
  }
  *(long *)((long)pvVar18 + IVar17 * 8) = lVar15;
  if (lVar12 == 4) {
    pnga_pgroup_gop(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                    (Integer)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                    (Integer)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
  }
  else {
    pnga_pgroup_gop(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                    (Integer)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                    (Integer)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
  }
  *puVar19 = 1;
  for (local_30 = 1; local_30 < IVar16; local_30 = local_30 + 1) {
    puVar19[local_30] = puVar19[local_30 + -1] + *(long *)((long)pvVar18 + (local_30 + -1) * 8);
  }
  puVar19[IVar16] = 1;
  pvVar18 = malloc(lVar15 * 8);
  for (local_30 = 0; local_30 < lVar15; local_30 = local_30 + 1) {
    in_stack_fffffffffffffd90 = (Integer *)(double)in_RSI;
    DVar22 = pnga_rand(in_stack_00001120);
    *(long *)((long)pvVar18 + local_30 * 8) = (long)((double)in_stack_fffffffffffffd90 * DVar22);
  }
  __ptr = malloc(lVar15 * SPA[lVar14].size);
  for (local_30 = 0; local_30 < lVar15; local_30 = local_30 + 1) {
    DVar22 = pnga_rand(in_stack_00001120);
    if ((int)(DVar22 * 2.0) == 0) {
      local_144 = -1;
    }
    else {
      local_144 = 1;
    }
    if (lVar13 == 0x3e9) {
      *(int *)((long)__ptr + local_30 * 4) = local_144;
    }
    else if (lVar13 == 0x3ea) {
      *(long *)((long)__ptr + local_30 * 8) = (long)local_144;
    }
    else if (lVar13 == 0x3f8) {
      *(long *)((long)__ptr + local_30 * 8) = (long)local_144;
    }
    else if (lVar13 == 0x3eb) {
      *(float *)((long)__ptr + local_30 * 4) = (float)local_144;
    }
    else if (lVar13 == 0x3ec) {
      *(double *)((long)__ptr + local_30 * 8) = (double)local_144;
    }
    else if (lVar13 == 0x3ee) {
      *(float *)((long)__ptr + local_30 * 8) = (float)local_144;
      *(undefined4 *)((long)__ptr + local_30 * 8 + 4) = 0;
    }
    else if (lVar13 == 0x3ef) {
      *(double *)((long)__ptr + local_30 * 0x10) = (double)local_144;
      *(undefined8 *)((long)__ptr + local_30 * 0x10 + 8) = 0;
    }
  }
  IVar16 = pnga_create_handle();
  *in_RCX = IVar16;
  pnga_set_data(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                (Integer)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                (Integer)in_stack_fffffffffffffd98);
  pnga_set_irreg_distr
            (CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(Integer *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  pnga_set_pgroup((Integer)in_stack_fffffffffffffd90,(Integer)in_stack_fffffffffffffd88);
  pnga_allocate(in_stack_000002f0);
  IVar16 = pnga_create_handle();
  *in_RDX = IVar16;
  pnga_set_data(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                (Integer)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                (Integer)in_stack_fffffffffffffd98);
  pnga_set_irreg_distr
            (CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(Integer *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  pnga_set_pgroup((Integer)in_stack_fffffffffffffd90,(Integer)in_stack_fffffffffffffd88);
  pnga_allocate(in_stack_000002f0);
  pvVar20 = malloc(lVar15 * 4);
  for (local_30 = 0; local_30 < lVar15; local_30 = local_30 + 1) {
    *(int *)((long)pvVar20 + local_30 * 4) = (int)*(undefined8 *)((long)pvVar18 + local_30 * 8);
  }
  pnga_put(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8,
           in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  free(pvVar20);
  pnga_put(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8,
           in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  pnga_pgroup_sync((Integer)in_stack_fffffffffffffd90);
  IVar16 = pnga_create_handle();
  pnga_set_data(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                (Integer)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                (Integer)in_stack_fffffffffffffd98);
  pnga_set_pgroup((Integer)in_stack_fffffffffffffd90,(Integer)in_stack_fffffffffffffd88);
  pnga_allocate(in_stack_000002f0);
  pnga_zero(in_stack_fffffffffffffeb0);
  pvVar20 = malloc(in_RSI << 3);
  __ptr_00 = malloc(lVar15 * 8);
  for (local_30 = 0; local_30 < in_RSI; local_30 = local_30 + 1) {
    *(undefined8 *)((long)pvVar20 + local_30 * 8) = 0xffffffffffffffff;
  }
  for (local_30 = 0; local_30 < lVar15; local_30 = local_30 + 1) {
    *(undefined8 *)((long)__ptr_00 + local_30 * 8) =
         *(undefined8 *)((long)pvVar20 + *(long *)((long)pvVar18 + local_30 * 8) * 8);
    *(long *)((long)pvVar20 + *(long *)((long)pvVar18 + local_30 * 8) * 8) = local_30;
  }
  __ptr_01 = malloc(lVar11 * SPA[lVar14].size);
  for (local_f0 = 0; local_f0 < in_RSI; local_f0 = local_f0 + 1) {
    if (-1 < *(long *)((long)pvVar20 + local_f0 * 8)) {
      lVar15 = *(long *)((long)pvVar20 + local_f0 * 8);
      memset(__ptr_01,0,lVar11 * SPA[lVar14].size);
      for (; -1 < lVar15; lVar15 = *(long *)((long)__ptr_00 + lVar15 * 8)) {
        for (local_50 = 0; local_50 < SPA[lVar14].nblocks; local_50 = local_50 + 1) {
          local_158 = SPA[lVar14].blkidx[local_50];
          pnga_sprs_array_column_distribution(in_RDI,local_158,&local_168,&local_170);
          if (lVar12 == 4) {
            pnga_sprs_array_access_col_block
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10
                       ,(void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       (void *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
            iVar9 = *(int *)(local_178 + 4 + lVar15 * 4);
            iVar10 = *(int *)(local_178 + lVar15 * 4);
            for (local_e8 = 0; local_e8 < iVar9 - iVar10; local_e8 = local_e8 + 1) {
              lVar21 = (long)*(int *)(local_180 + (*(int *)(local_178 + lVar15 * 4) + local_e8) * 4)
              ;
              if (lVar13 == 0x3e9) {
                *(int *)((long)__ptr_01 + lVar21 * 4) =
                     *(int *)((long)__ptr + lVar15 * 4) *
                     *(int *)(local_160 + (*(int *)(local_178 + lVar15 * 4) + local_e8) * 4) +
                     *(int *)((long)__ptr_01 + lVar21 * 4);
              }
              else if (lVar13 == 0x3ea) {
                *(long *)((long)__ptr_01 + lVar21 * 8) =
                     *(long *)((long)__ptr + lVar15 * 8) *
                     *(long *)(local_160 + (*(int *)(local_178 + lVar15 * 4) + local_e8) * 8) +
                     *(long *)((long)__ptr_01 + lVar21 * 8);
              }
              else if (lVar13 == 0x3f8) {
                *(long *)((long)__ptr_01 + lVar21 * 8) =
                     *(long *)((long)__ptr + lVar15 * 8) *
                     *(long *)(local_160 + (*(int *)(local_178 + lVar15 * 4) + local_e8) * 8) +
                     *(long *)((long)__ptr_01 + lVar21 * 8);
              }
              else if (lVar13 == 0x3eb) {
                *(float *)((long)__ptr_01 + lVar21 * 4) =
                     *(float *)((long)__ptr + lVar15 * 4) *
                     *(float *)(local_160 + (*(int *)(local_178 + lVar15 * 4) + local_e8) * 4) +
                     *(float *)((long)__ptr_01 + lVar21 * 4);
              }
              else if (lVar13 == 0x3ec) {
                *(double *)((long)__ptr_01 + lVar21 * 8) =
                     *(double *)((long)__ptr + lVar15 * 8) *
                     *(double *)(local_160 + (*(int *)(local_178 + lVar15 * 4) + local_e8) * 8) +
                     *(double *)((long)__ptr_01 + lVar21 * 8);
              }
              else if (lVar13 == 0x3ee) {
                fVar1 = *(float *)((long)__ptr + lVar15 * 8);
                fVar2 = *(float *)((long)__ptr + lVar15 * 8 + 4);
                fVar3 = *(float *)(local_160 + (*(int *)(local_178 + lVar15 * 4) + local_e8) * 8);
                fVar4 = *(float *)(local_160 + 4 + (*(int *)(local_178 + lVar15 * 4) + local_e8) * 8
                                  );
                *(float *)((long)__ptr_01 + lVar21 * 8) =
                     fVar1 * fVar3 + -(fVar2 * fVar4) + *(float *)((long)__ptr_01 + lVar21 * 8);
                *(float *)((long)__ptr_01 + lVar21 * 8 + 4) =
                     fVar1 * fVar4 + fVar2 * fVar3 + *(float *)((long)__ptr_01 + lVar21 * 8 + 4);
              }
              else if (lVar13 == 0x3ef) {
                dVar5 = *(double *)((long)__ptr + lVar15 * 0x10);
                dVar6 = *(double *)((long)__ptr + lVar15 * 0x10 + 8);
                dVar7 = *(double *)
                         (local_160 + (*(int *)(local_178 + lVar15 * 4) + local_e8) * 0x10);
                dVar8 = *(double *)
                         (local_160 + 8 + (*(int *)(local_178 + lVar15 * 4) + local_e8) * 0x10);
                *(double *)((long)__ptr_01 + lVar21 * 0x10) =
                     dVar5 * dVar7 + -(dVar6 * dVar8) + *(double *)((long)__ptr_01 + lVar21 * 0x10);
                *(double *)((long)__ptr_01 + lVar21 * 0x10 + 8) =
                     dVar5 * dVar8 + dVar6 * dVar7 + *(double *)((long)__ptr_01 + lVar21 * 0x10 + 8)
                ;
              }
            }
          }
          else {
            pnga_sprs_array_access_col_block
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10
                       ,(void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       (void *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
            in_stack_fffffffffffffe20 = lVar15;
            in_stack_fffffffffffffe18 =
                 *(long *)(local_1d0 + 8 + in_stack_fffffffffffffe20 * 8) -
                 *(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8);
            for (local_e8 = 0; lVar15 = in_stack_fffffffffffffe20,
                local_e8 < in_stack_fffffffffffffe18; local_e8 = local_e8 + 1) {
              in_stack_fffffffffffffe10 =
                   *(void **)(local_1d8 +
                             (*(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8) + local_e8) * 8);
              if (lVar13 == 0x3e9) {
                *(int *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 4) =
                     *(int *)((long)__ptr + in_stack_fffffffffffffe20 * 4) *
                     *(int *)(local_160 +
                             (*(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8) + local_e8) * 4)
                     + *(int *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 4);
              }
              else if (lVar13 == 0x3ea) {
                *(long *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 8) =
                     *(long *)((long)__ptr + in_stack_fffffffffffffe20 * 8) *
                     *(long *)(local_160 +
                              (*(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8) + local_e8) * 8)
                     + *(long *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 8);
              }
              else if (lVar13 == 0x3f8) {
                *(long *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 8) =
                     *(long *)((long)__ptr + in_stack_fffffffffffffe20 * 8) *
                     *(long *)(local_160 +
                              (*(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8) + local_e8) * 8)
                     + *(long *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 8);
              }
              else if (lVar13 == 0x3eb) {
                *(float *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 4) =
                     *(float *)((long)__ptr + in_stack_fffffffffffffe20 * 4) *
                     *(float *)(local_160 +
                               (*(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8) + local_e8) * 4
                               ) + *(float *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 4);
              }
              else if (lVar13 == 0x3ec) {
                *(double *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 8) =
                     *(double *)((long)__ptr + in_stack_fffffffffffffe20 * 8) *
                     *(double *)
                      (local_160 +
                      (*(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8) + local_e8) * 8) +
                     *(double *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 8);
              }
              else if (lVar13 == 0x3ee) {
                in_stack_fffffffffffffe0c = *(float *)((long)__ptr + in_stack_fffffffffffffe20 * 8);
                in_stack_fffffffffffffe08 =
                     *(float *)((long)__ptr + in_stack_fffffffffffffe20 * 8 + 4);
                in_stack_fffffffffffffe04 =
                     *(float *)(local_160 +
                               (*(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8) + local_e8) * 8
                               );
                in_stack_fffffffffffffe00 =
                     *(float *)(local_160 + 4 +
                               (*(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8) + local_e8) * 8
                               );
                *(float *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 8) =
                     in_stack_fffffffffffffe0c * in_stack_fffffffffffffe04 +
                     -(in_stack_fffffffffffffe08 * in_stack_fffffffffffffe00) +
                     *(float *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 8);
                *(float *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 8 + 4) =
                     in_stack_fffffffffffffe0c * in_stack_fffffffffffffe00 +
                     in_stack_fffffffffffffe08 * in_stack_fffffffffffffe04 +
                     *(float *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 8 + 4);
              }
              else if (lVar13 == 0x3ef) {
                dVar5 = *(double *)((long)__ptr + in_stack_fffffffffffffe20 * 0x10);
                dVar6 = *(double *)((long)__ptr + in_stack_fffffffffffffe20 * 0x10 + 8);
                dVar7 = *(double *)
                         (local_160 +
                         (*(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8) + local_e8) * 0x10);
                dVar8 = *(double *)
                         (local_160 + 8 +
                         (*(long *)(local_1d0 + in_stack_fffffffffffffe20 * 8) + local_e8) * 0x10);
                *(double *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 0x10) =
                     dVar5 * dVar7 + -(dVar6 * dVar8) +
                     *(double *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 0x10);
                *(double *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 0x10 + 8) =
                     dVar5 * dVar8 + dVar6 * dVar7 +
                     *(double *)((long)__ptr_01 + (long)in_stack_fffffffffffffe10 * 0x10 + 8);
              }
            }
          }
        }
      }
      if (lVar13 == 0x3e9) {
        pnga_acc(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      }
      else if (lVar13 == 0x3ea) {
        pnga_acc(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      }
      else if (lVar13 == 0x3f8) {
        pnga_acc(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      }
      else if (lVar13 == 0x3eb) {
        pnga_acc(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      }
      else if (lVar13 == 0x3ec) {
        pnga_acc(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      }
      else if (lVar13 == 0x3ee) {
        in_stack_fffffffffffffdb0 = 0x3f800000;
        in_stack_fffffffffffffdb4 = 0;
        pnga_acc(0x3f800000,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      }
      else if (lVar13 == 0x3ef) {
        in_stack_fffffffffffffd98 = (void *)0x3ff0000000000000;
        in_stack_fffffffffffffda0 = (Integer *)0x0;
        pnga_acc(CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8,(Integer *)0x0,(void *)0x3ff0000000000000,
                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      }
    }
  }
  pnga_pgroup_sync((Integer)in_stack_fffffffffffffd90);
  free(__ptr_01);
  free(pvVar18);
  free(__ptr);
  free(pvVar20);
  free(__ptr_00);
  return IVar16;
}

Assistant:

Integer pnga_sprs_array_count_sketch(Integer s_a, Integer size_k,
    Integer *g_k, Integer *g_w, Integer trans)
{
  Integer i, ii, j, jj, n, hdl, g_a;
  Integer nrows;
  hdl = s_a + GA_OFFSET;
  Integer *klabels;
  void *kweights;
  Integer idim, jdim;
  Integer dims[2];
  Integer one = 1;
  Integer two = 2;
  Integer nblocks[2];
  Integer *top;
  Integer *list;
  void *kbuf;
  Integer nprocs, me;
  Integer k, kk, kcnt;
  Integer idx_size;
  Integer type;
  Integer lo[2], hi[2], ld;
  Integer *map, *size;
  if (SPA[hdl].idim < size_k) {
    pnga_error("Row dimension of sketch matrix must be less than row"
        "dimension of original matrix",size_k);
  }
  /* accumulate operation does not support type C_LONGLONG so fail if this
   *    * data type encountered */
  if (SPA[hdl].type == C_LONGLONG) {
    pnga_error("Data type of sparse matrix"
        " cannot be of type long long",SPA[hdl].type);
  }
  /* how many rows do I own */
  nrows = SPA[hdl].ihi-SPA[hdl].ilo+1;
  idim = SPA[hdl].idim;
  jdim = SPA[hdl].jdim;
  idx_size = SPA[hdl].idx_size;
  type = SPA[hdl].type;
  nprocs = pnga_pgroup_nnodes(SPA[hdl].grp);
  me = pnga_pgroup_nodeid(SPA[hdl].grp);
  /* create map array */
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = nrows;
  if (idx_size == 4) {
    pnga_pgroup_gop(SPA[hdl].grp,C_INT,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl].grp,C_LONG,size,nprocs,"+");
  }
  map[0] = 1;
  for (i=1; i<nprocs; i++) {
    map[i] = map[i-1] + size[i-1];
  }
  map[nprocs] = 1;
  nblocks[0] = nprocs;
  nblocks[1] = 1;
  /* Assign each row to a label in the range  [0,size_k-1] */
  klabels = (Integer*)malloc(nrows*sizeof(Integer));
  for (i=0; i<nrows; i++) {
    klabels[i] = (Integer)(((double)size_k)*pnga_rand(0));
  }
  /* Assign each row a weight +/-1 */
  kweights = malloc(nrows*SPA[hdl].size);
  for (i=0; i<nrows; i++) {
    int val = (int)(2.0*pnga_rand(0));
    if (val == 0) {
      val = -1;
    } else {
      val = 1;
    }
    if (type == C_INT) {
      ((int*)kweights)[i] = val;
    } else if (type == C_LONG) {
      ((long*)kweights)[i] = (long)val;
    } else if (type == C_LONGLONG) {
      ((long long*)kweights)[i] = (long long)val;
    } else if (type == C_FLOAT) {
      ((float*)kweights)[i] = (float)val;
    } else if (type == C_DBL) {
      ((double*)kweights)[i] = (double)val;
    } else if (type == C_SCPL) {
      ((float*)kweights)[2*i] = (float)val;
      ((float*)kweights)[2*i+1] = 0.0;
    } else if (type == C_DCPL) {
      ((double*)kweights)[2*i] = (double)val;
      ((double*)kweights)[2*i+1] = 0.0;
    }
  }
  /* create distributed vectors to hold values in kweights and klabels */
  *g_w = pnga_create_handle();
  dims[0] = idim;
  pnga_set_data(*g_w,one,dims,SPA[hdl].type);
  pnga_set_irreg_distr(*g_w,map,nblocks);
  pnga_set_pgroup(*g_w,SPA[hdl].grp);
  pnga_allocate(*g_w);

  *g_k = pnga_create_handle();
  pnga_set_data(*g_k,one,dims,C_INT);
  pnga_set_irreg_distr(*g_k,map,nblocks);
  pnga_set_pgroup(*g_k,SPA[hdl].grp);
  pnga_allocate(*g_k);

  /* fill k-label and weight arrays */
  lo[0] = SPA[hdl].ilo+1; 
  hi[0] = SPA[hdl].ihi+1; 
  ld = nrows;
  kbuf = malloc(nrows*sizeof(int));
  for (i=0; i<nrows; i++) {
    ((int*)kbuf)[i] = (int)klabels[i];
  }
  pnga_put(*g_k,lo,hi,kbuf,&ld);
  free(kbuf);
  pnga_put(*g_w,lo,hi,kweights,&ld);
  pnga_pgroup_sync(SPA[hdl].grp);
  /* Create an output matrix of size_k by jdim */
  g_a = pnga_create_handle();
  if (trans) {
    dims[0] = jdim;
    dims[1] = size_k;
  } else {
    dims[0] = size_k;
    dims[1] = jdim;
  }
  pnga_set_data(g_a,two,dims,SPA[hdl].type);
  pnga_set_pgroup(g_a,SPA[hdl].grp);
  pnga_allocate(g_a);
  pnga_zero(g_a);

  /* create a linked list of rows that map to each k-index */
  top = (Integer*)malloc(size_k*sizeof(Integer));
  list = (Integer*)malloc(nrows*sizeof(Integer));
  for (i=0; i<size_k; i++) top[i] = -1;
  for (i=0; i<nrows; i++) {
    list[i] = top[klabels[i]];
    top[klabels[i]] = i;
  }
  
  /* loop over all values of k */
  kbuf = malloc(jdim*SPA[hdl].size);
  if (trans) {
    lo[0] = 1;
    hi[0] = jdim;
    ld = jdim;
  } else {
    lo[1] = 1;
    hi[1] = jdim;
    ld = 1;
  }
  for (kk = 0; kk<size_k; kk++) {
    /* accumulate all non-zero values that contribute to this value of k */
    if (top[kk] > -1) {
      Integer irow = top[kk];
      memset(kbuf,0,jdim*SPA[hdl].size);
      while (irow > -1) {
        /* loop over column blocks */
        if (trans) {
          lo[1] = kk+1;
          hi[1] = kk+1;
        } else {
          lo[0] = kk+1;
          hi[0] = kk+1;
        }
        for (n=0; n<SPA[hdl].nblocks; n++) {
          Integer nblk = SPA[hdl].blkidx[n];
          void *vptr;
          Integer jlo, jhi;
          pnga_sprs_array_column_distribution(s_a,nblk,&jlo,&jhi);
          if (idx_size == 4) {
            int *iptr;
            int *jptr;
            pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&vptr);
            Integer idx = irow;
            Integer kcols = iptr[idx+1]-iptr[idx];
            for (k = 0; k<kcols; k++) {
              Integer jdx = jptr[iptr[idx]+k];
              if (type == C_INT) {
                ((int*)kbuf)[jdx] += ((int*)kweights)[idx]*
                  ((int*)vptr)[iptr[idx]+k];
              } else if (type == C_LONG) {
                ((long*)kbuf)[jdx] += ((long*)kweights)[idx]*
                  ((long*)vptr)[iptr[idx]+k];
              } else if (type == C_LONGLONG) {
                ((long long*)kbuf)[jdx] += ((long long*)kweights)[idx]*
                  ((long long*)vptr)[iptr[idx]+k];
              } else if (type == C_FLOAT) {
                ((float*)kbuf)[jdx] += ((float*)kweights)[idx]*
                  ((float*)vptr)[iptr[idx]+k];
              } else if (type == C_DBL) {
                ((double*)kbuf)[jdx] += ((double*)kweights)[idx]*
                  ((double*)vptr)[iptr[idx]+k];
              } else if (type == C_SCPL) {
                float rw, iw, rv, iv;
                rw = ((float*)kweights)[2*idx];
                iw = ((float*)kweights)[2*idx+1];
                rv = ((float*)vptr)[2*(iptr[idx]+k)];
                iv = ((float*)vptr)[2*(iptr[idx]+k)+1];
                ((float*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((float*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              } else if (type == C_DCPL) {
                double rw, iw, rv, iv;
                rw = ((double*)kweights)[2*idx];
                iw = ((double*)kweights)[2*idx+1];
                rv = ((double*)vptr)[2*(iptr[idx]+k)];
                iv = ((double*)vptr)[2*(iptr[idx]+k)+1];
                ((double*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((double*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              }
            }
          } else {
            int64_t *iptr;
            int64_t *jptr;
            pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&vptr);
            Integer idx = irow;
            Integer kcols = iptr[idx+1]-iptr[idx];
            for (k = 0; k<kcols; k++) {
              Integer jdx = jptr[iptr[idx]+k];
              if (type == C_INT) {
                ((int*)kbuf)[jdx] += ((int*)kweights)[idx]*
                  ((int*)vptr)[iptr[idx]+k];
              } else if (type == C_LONG) {
                ((long*)kbuf)[jdx] += ((long*)kweights)[idx]*
                  ((long*)vptr)[iptr[idx]+k];
              } else if (type == C_LONGLONG) {
                ((long long*)kbuf)[jdx] += ((long long*)kweights)[idx]*
                  ((long long*)vptr)[iptr[idx]+k];
              } else if (type == C_FLOAT) {
                ((float*)kbuf)[jdx] += ((float*)kweights)[idx]*
                  ((float*)vptr)[iptr[idx]+k];
              } else if (type == C_DBL) {
                ((double*)kbuf)[jdx] += ((double*)kweights)[idx]*
                  ((double*)vptr)[iptr[idx]+k];
              } else if (type == C_SCPL) {
                float rw, iw, rv, iv;
                rw = ((float*)kweights)[2*idx];
                iw = ((float*)kweights)[2*idx+1];
                rv = ((float*)vptr)[2*(iptr[idx]+k)];
                iv = ((float*)vptr)[2*(iptr[idx]+k)+1];
                ((float*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((float*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              } else if (type == C_DCPL) {
                double rw, iw, rv, iv;
                rw = ((double*)kweights)[2*idx];
                iw = ((double*)kweights)[2*idx+1];
                rv = ((double*)vptr)[2*(iptr[idx]+k)];
                iv = ((double*)vptr)[2*(iptr[idx]+k)+1];
                ((double*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((double*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              }
            }
          }
        }
        irow = list[irow];
      }
      /* accumulate row into g_a */
      if (type == C_INT) {
        int ione = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &ione);
      } else if (type == C_LONG) {
        long lone = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &lone);
      } else if (type == C_LONGLONG) {
        long long llone = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &llone);
      } else if (type == C_FLOAT) {
        float fone = 1.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &fone);
      } else if (type == C_DBL) {
        double done = 1.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &done);
      } else if (type == C_SCPL) {
        float cone[2];
        cone[0] = 1.0;
        cone[1] = 0.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &cone);
      } else if (type == C_DCPL) {
        double zone[2];
        zone[0] = 1.0;
        zone[1] = 0.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &zone);
      }
    }
  }
  pnga_pgroup_sync(SPA[hdl].grp);

  /* free up arrays */
  free(kbuf);
  free(klabels);
  free(kweights);
  free(top);
  free(list);
  return g_a;
}